

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

double matd_vec_mag(matd_t *a)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x34c,"double matd_vec_mag(const matd_t *)");
  }
  if (a->nrows == 1 || a->ncols == 1) {
    uVar1 = a->nrows * a->ncols;
    uVar3 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar3;
    }
    dVar4 = 0.0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      dVar4 = dVar4 + (double)a[uVar3 + 1] * (double)a[uVar3 + 1];
    }
    if (0.0 <= dVar4) {
      return SQRT(dVar4);
    }
    dVar4 = sqrt(dVar4);
    return dVar4;
  }
  __assert_fail("matd_is_vector(a)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x34d,"double matd_vec_mag(const matd_t *)");
}

Assistant:

double matd_vec_mag(const matd_t *a)
{
    assert(a != NULL);
    assert(matd_is_vector(a));

    double mag = 0.0;
    int len = a->nrows*a->ncols;
    for (int i = 0; i < len; i++)
        mag += sq(a->data[i]);
    return sqrt(mag);
}